

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

int lws_write(lws *wsi,uchar *buf,size_t len,lws_write_protocol wp)

{
  lws_context_per_thread *pt_00;
  int m;
  lws_context_per_thread *pt;
  size_t sStack_28;
  lws_write_protocol wp_local;
  size_t len_local;
  uchar *buf_local;
  lws *wsi_local;
  
  pt_00 = wsi->context->pt + (int)wsi->tsi;
  pt._4_4_ = wp;
  sStack_28 = len;
  len_local = (size_t)buf;
  buf_local = (uchar *)wsi;
  lws_stats_bump(pt_00,3,1);
  if ((int)sStack_28 < 0) {
    _lws_log(1,"%s: suspicious len int %d, ulong %lu\n","lws_write",sStack_28 & 0xffffffff,sStack_28
            );
    wsi_local._4_4_ = -1;
  }
  else {
    lws_stats_bump(pt_00,0x10,sStack_28);
    if (*(long *)(buf_local + 0x220) == 0) {
      __assert_fail("wsi->role_ops",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/output.c"
                    ,0xfd,
                    "int lws_write(struct lws *, unsigned char *, size_t, enum lws_write_protocol)")
      ;
    }
    if (*(long *)(*(long *)(buf_local + 0x220) + 0x60) == 0) {
      wsi_local._4_4_ = lws_issue_raw((lws *)buf_local,(uchar *)len_local,sStack_28);
    }
    else {
      wsi_local._4_4_ =
           (**(code **)(*(long *)(buf_local + 0x220) + 0x60))
                     (buf_local,len_local,sStack_28,(long)&pt + 4);
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_write(struct lws *wsi, unsigned char *buf, size_t len,
	  enum lws_write_protocol wp)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
#if defined(LWS_WITH_DETAILED_LATENCY)
	lws_usec_t us;
#endif
	int m;

	lws_stats_bump(pt, LWSSTATS_C_API_LWS_WRITE, 1);

	if ((int)len < 0) {
		lwsl_err("%s: suspicious len int %d, ulong %lu\n", __func__,
				(int)len, (unsigned long)len);
		return -1;
	}

	lws_stats_bump(pt, LWSSTATS_B_WRITE, len);

#ifdef LWS_WITH_ACCESS_LOG
	wsi->http.access_log.sent += len;
#endif
#if defined(LWS_WITH_SERVER_STATUS)
	if (wsi->vhost)
		wsi->vhost->conn_stats.tx += len;
#endif
#if defined(LWS_WITH_DETAILED_LATENCY)
	us = lws_now_usecs();
#endif

	assert(wsi->role_ops);
	if (!wsi->role_ops->write_role_protocol)
		return lws_issue_raw(wsi, buf, len);

	m = wsi->role_ops->write_role_protocol(wsi, buf, len, &wp);
	if (m < 0)
		return m;

#if defined(LWS_WITH_DETAILED_LATENCY)
	if (wsi->context->detailed_latency_cb) {
		wsi->detlat.req_size = len;
		wsi->detlat.acc_size = m;
		wsi->detlat.type = LDLT_WRITE;
		if (wsi->detlat.earliest_write_req_pre_write)
			wsi->detlat.latencies[LAT_DUR_PROXY_PROXY_REQ_TO_WRITE] =
					us - wsi->detlat.earliest_write_req_pre_write;
		else
			wsi->detlat.latencies[LAT_DUR_PROXY_PROXY_REQ_TO_WRITE] = 0;
		wsi->detlat.latencies[LAT_DUR_USERCB] = lws_now_usecs() - us;
		lws_det_lat_cb(wsi->context, &wsi->detlat);

	}
#endif

	return m;
}